

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void train(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  bool bVar1;
  byte bVar2;
  int64_t iVar3;
  invalid_argument *this;
  Args *this_00;
  Autotune autotune;
  ofstream ofs;
  string outputFileName;
  shared_ptr<fasttext::FastText> fasttext;
  Args a;
  Autotune *in_stack_fffffffffffffad0;
  shared_ptr<fasttext::FastText> *in_stack_fffffffffffffad8;
  Autotune *in_stack_fffffffffffffae0;
  char *in_stack_fffffffffffffaf0;
  undefined7 in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffaff;
  Args *in_stack_fffffffffffffb20;
  string local_4c0 [135];
  undefined1 local_439;
  string local_438 [32];
  undefined1 local_418 [96];
  Args *in_stack_fffffffffffffc48;
  string *in_stack_fffffffffffffd18;
  FastText *in_stack_fffffffffffffd20;
  string *in_stack_fffffffffffffd98;
  FastText *in_stack_fffffffffffffda0;
  TrainCallback *in_stack_fffffffffffffdc0;
  Args *in_stack_fffffffffffffdc8;
  FastText *in_stack_fffffffffffffdd0;
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe88;
  Args *in_stack_fffffffffffffe90;
  byte local_90;
  
  ::fasttext::Args::Args(in_stack_fffffffffffffb20);
  ::fasttext::Args::parseArgs(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::make_shared<fasttext::FastText>();
  std::__cxx11::string::string(local_1d8);
  bVar1 = ::fasttext::Args::hasAutotune((Args *)0x171cd0);
  if (bVar1) {
    iVar3 = ::fasttext::Args::getAutotuneModelSize(in_stack_fffffffffffffc48);
    if (((double)iVar3 != -1.0) || (NAN((double)iVar3))) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf0);
      std::__cxx11::string::operator=(local_1d8,local_1f8);
      std::__cxx11::string::~string(local_1f8);
      goto LAB_00171dc7;
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8),
                 in_stack_fffffffffffffaf0);
  std::__cxx11::string::operator=(local_1d8,local_218);
  std::__cxx11::string::~string(local_218);
LAB_00171dc7:
  std::ofstream::ofstream(local_418,local_1d8,_S_out);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) != 0) {
    std::ofstream::close();
    bVar1 = ::fasttext::Args::hasAutotune((Args *)0x171ef9);
    if (bVar1) {
      ::fasttext::Autotune::Autotune(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      ::fasttext::Autotune::train
                ((Autotune *)a.manualArgs_._M_h._M_single_bucket,
                 (Args *)a.manualArgs_._M_h._M_rehash_policy._M_next_resize);
      ::fasttext::Autotune::~Autotune(in_stack_fffffffffffffad0);
    }
    else {
      std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x171f7c);
      std::function<void_(float,_float,_double,_double,_long)>::function
                ((function<void_(float,_float,_double,_double,_long)> *)in_stack_fffffffffffffad0);
      ::fasttext::FastText::train
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      std::function<void_(float,_float,_double,_double,_long)>::~function
                ((function<void_(float,_float,_double,_double,_long)> *)0x171fb9);
    }
    std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x171fee);
    ::fasttext::FastText::saveModel(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    this_00 = (Args *)std::
                      __shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x17200d);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar2,in_stack_fffffffffffffaf8),in_stack_fffffffffffffaf0);
    ::fasttext::FastText::saveVectors(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::~string(local_4c0);
    if ((local_90 & 1) != 0) {
      std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x172063);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar2,in_stack_fffffffffffffaf8),in_stack_fffffffffffffaf0);
      ::fasttext::FastText::saveOutput(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffb20);
    }
    std::ofstream::~ofstream(local_418);
    std::__cxx11::string::~string(local_1d8);
    std::shared_ptr<fasttext::FastText>::~shared_ptr((shared_ptr<fasttext::FastText> *)0x172105);
    ::fasttext::Args::~Args(this_00);
    return;
  }
  local_439 = 1;
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar2,in_stack_fffffffffffffaf8),(char *)this);
  std::invalid_argument::invalid_argument(this,local_438);
  local_439 = 0;
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void train(const std::vector<std::string> args) {
  Args a = Args();
  a.parseArgs(args);
  std::shared_ptr<FastText> fasttext = std::make_shared<FastText>();
  std::string outputFileName;

  if (a.hasAutotune() &&
      a.getAutotuneModelSize() != Args::kUnlimitedModelSize) {
    outputFileName = a.output + ".ftz";
  } else {
    outputFileName = a.output + ".bin";
  }
  std::ofstream ofs(outputFileName);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        outputFileName + " cannot be opened for saving.");
  }
  ofs.close();
  if (a.hasAutotune()) {
    Autotune autotune(fasttext);
    autotune.train(a);
  } else {
    fasttext->train(a);
  }
  fasttext->saveModel(outputFileName);
  fasttext->saveVectors(a.output + ".vec");
  if (a.saveOutput) {
    fasttext->saveOutput(a.output + ".output");
  }
}